

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

Matcher<const_std::pair<const_int,_int>_&> * __thiscall
testing::internal::PairMatcher::operator_cast_to_Matcher
          (Matcher<const_std::pair<const_int,_int>_&> *__return_storage_ptr__,PairMatcher *this)

{
  PairMatcherImpl<std::pair<int_const,int>const&> *this_00;
  undefined4 *puVar1;
  
  this_00 = (PairMatcherImpl<std::pair<int_const,int>const&> *)operator_new(0x38);
  PairMatcherImpl<std::pair<int_const,int>const&>::PairMatcherImpl<int,int>
            (this_00,*(int *)this,*(int *)(this + 4));
  (__return_storage_ptr__->super_MatcherBase<const_std::pair<const_int,_int>_&>).vtable_ =
       (VTable *)
       MatcherBase<std::pair<int_const,int>const&>::
       GetVTable<testing::internal::MatcherBase<std::pair<int_const,int>const&>::ValuePolicy<testing::MatcherInterface<std::pair<int_const,int>const&>const*,true>>()
       ::kVTable;
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 1;
  *(PairMatcherImpl<std::pair<int_const,int>const&> **)(puVar1 + 2) = this_00;
  (__return_storage_ptr__->super_MatcherBase<const_std::pair<const_int,_int>_&>).buffer_.ptr =
       puVar1;
  (__return_storage_ptr__->super_MatcherBase<const_std::pair<const_int,_int>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0046a410;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<PairType>() const {
    return Matcher<PairType>(
        new PairMatcherImpl<const PairType&>(first_matcher_, second_matcher_));
  }